

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O2

bool __thiscall
HighsHashTable<unsigned_long,_void>::findPosition
          (HighsHashTable<unsigned_long,_void> *this,KeyType *key,u8 *meta,u64 *startPos,u64 *maxPos
          ,u64 *pos)

{
  byte bVar1;
  _Head_base<0UL,_HighsHashTableEntry<unsigned_long,_void>_*,_false> _Var2;
  uchar *puVar3;
  u64 uVar4;
  u64 uVar5;
  ulong uVar6;
  
  uVar4 = HighsHashHelpers::hash<unsigned_long,_0>(key);
  uVar6 = uVar4 >> ((byte)this->numHashShift & 0x3f);
  *startPos = uVar6;
  *maxPos = uVar6 + 0x7f & this->tableSizeMask;
  *meta = (byte)(uVar4 >> ((byte)this->numHashShift & 0x3f)) | 0x80;
  _Var2._M_head_impl =
       (this->entries)._M_t.
       super___uniq_ptr_impl<HighsHashTableEntry<unsigned_long,_void>,_HighsHashTable<unsigned_long,_void>::OpNewDeleter>
       ._M_t.
       super__Tuple_impl<0UL,_HighsHashTableEntry<unsigned_long,_void>_*,_HighsHashTable<unsigned_long,_void>::OpNewDeleter>
       .super__Head_base<0UL,_HighsHashTableEntry<unsigned_long,_void>_*,_false>._M_head_impl;
  uVar5 = *startPos;
  *pos = uVar5;
  puVar3 = (this->metadata)._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  do {
    bVar1 = puVar3[uVar5];
    if (-1 < (char)bVar1) {
      return false;
    }
    if ((bVar1 == *meta) && (*key == _Var2._M_head_impl[uVar5].value_)) {
      return true;
    }
    if ((ulong)((int)uVar5 - (uint)bVar1 & 0x7f) < (uVar5 - *startPos & this->tableSizeMask)) {
      return false;
    }
    uVar5 = uVar5 + 1 & this->tableSizeMask;
    *pos = uVar5;
  } while (uVar5 != *maxPos);
  return false;
}

Assistant:

bool findPosition(const KeyType& key, u8& meta, u64& startPos, u64& maxPos,
                    u64& pos) const {
    u64 hash = HighsHashHelpers::hash(key);
    startPos = hash >> numHashShift;
    maxPos = (startPos + maxDistance()) & tableSizeMask;
    meta = toMetadata(hash);

    const Entry* entryArray = entries.get();
    pos = startPos;
    do {
      if (!occupied(metadata[pos])) return false;
      if (metadata[pos] == meta &&
          HighsHashHelpers::equal(key, entryArray[pos].key()))
        return true;

      u64 currentDistance = (pos - startPos) & tableSizeMask;
      if (currentDistance > distanceFromIdealSlot(pos)) return false;

      pos = (pos + 1) & tableSizeMask;
    } while (pos != maxPos);

    return false;
  }